

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O1

void __thiscall ThreadPool::RunInThread(ThreadPool *this)

{
  CallFunc task;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if (this->m_bRunning == true) {
    do {
      Take((CallFunc *)&local_30,this);
      if (local_20 != (code *)0x0) {
        (*local_18)(&local_30);
      }
      if (local_20 != (code *)0x0) {
        (*local_20)(&local_30,&local_30,__destroy_functor);
      }
    } while (this->m_bRunning != false);
  }
  return;
}

Assistant:

void ThreadPool::RunInThread()
{
	while(m_bRunning)
	{
		CallFunc task = Take();
		if (task)
		{
			task();
		}
	}
}